

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

bool deqp::gls::StateQueryUtil::verifyBooleanValidity(ResultCollector *result,GLboolean v)

{
  ostream *poVar1;
  Hex<2UL> *value;
  ostringstream buf;
  string sStack_1b8;
  ulong local_198;
  ostringstream local_190 [376];
  
  if (1 < v) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,
                             "Boolean value was not neither GL_TRUE nor GL_FALSE, got ");
    local_198 = (ulong)v;
    de::toString<tcu::Format::Hex<2ul>>(&sStack_1b8,(de *)&local_198,value);
    std::operator<<(poVar1,(string *)&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return v < 2;
}

Assistant:

static bool verifyBooleanValidity (tcu::ResultCollector& result, glw::GLboolean v)
{
	if (v == GL_TRUE || v == GL_FALSE)
		return true;
	else
	{
		std::ostringstream buf;
		buf << "Boolean value was not neither GL_TRUE nor GL_FALSE, got " << de::toString(tcu::Format::Hex<2>(v));
		result.fail(buf.str());
		return false;
	}
}